

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::TypeSpecializeIntDst
          (GlobOpt *this,Instr *instr,OpCode originalOpCode,Value *valToTransfer,Value *src1Value,
          Value *src2Value,BailOutKind bailOutKind,ValueType valueType,int32 newMin,int32 newMax,
          Value **pDstVal,AddSubConstantInfo *addSubConstantInfo)

{
  code *pcVar1;
  byte bVar2;
  Instr *instr_00;
  bool bVar3;
  int32 n;
  BailOutKind e;
  undefined4 *puVar4;
  Value *pVVar5;
  GlobOptBlockData *pGVar6;
  ValueInfo *pVVar7;
  RegOpnd *pRVar8;
  Value *local_98;
  Value *local_90;
  bool local_85;
  bool local_61;
  bool wasNegativeZeroPreventedByBailout;
  IntBounds *local_58;
  IntBounds *dstBounds;
  Opnd *pOStack_48;
  bool isValueInfoPrecise;
  Opnd *dst;
  Value *src2Value_local;
  Value *src1Value_local;
  Value *valToTransfer_local;
  Instr *pIStack_20;
  OpCode originalOpCode_local;
  Instr *instr_local;
  GlobOpt *this_local;
  ValueType valueType_local;
  
  this_local._6_2_ = valueType.field_0;
  dst = (Opnd *)src2Value;
  src2Value_local = src1Value;
  src1Value_local = valToTransfer;
  valToTransfer_local._6_2_ = originalOpCode;
  pIStack_20 = instr;
  instr_local = (Instr *)this;
  bVar3 = ValueType::IsInt((ValueType *)((long)&this_local + 6));
  if ((!bVar3) &&
     ((((bVar3 = ValueType::IsNumber((ValueType *)((long)&this_local + 6)), !bVar3 ||
        (bVar3 = ValueType::IsLikelyInt((ValueType *)((long)&this_local + 6)), !bVar3)) ||
       (newMin != 0)) || (newMax != 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2191,
                       "(valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0))"
                       ,
                       "valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0)"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((src1Value_local != (Value *)0x0) && (src1Value_local != src2Value_local)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2192,"(!valToTransfer || valToTransfer == src1Value)",
                       "!valToTransfer || valToTransfer == src1Value");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((addSubConstantInfo != (AddSubConstantInfo *)0x0) &&
     (bVar3 = AddSubConstantInfo::HasInfo(addSubConstantInfo), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2193,"(!addSubConstantInfo || addSubConstantInfo->HasInfo())",
                       "!addSubConstantInfo || addSubConstantInfo->HasInfo()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOStack_48 = IR::Instr::GetDst(pIStack_20);
  if (pOStack_48 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2196,"(dst)","dst");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar3 = IsLoopPrePass(this);
  if (bVar3) {
    dstBounds._7_1_ =
         IsPrepassSrcValueInfoPrecise(this,pIStack_20,src2Value_local,(Value *)dst,(bool *)0x0);
    dstBounds._2_2_ = this_local._6_2_;
    dstBounds._4_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetPrepassValueTypeForDst
                   (this,this_local._6_2_,pIStack_20,src2Value_local,(Value *)dst,
                    (bool)dstBounds._7_1_,false);
    this_local._6_2_ = dstBounds._4_2_;
  }
  else {
    dstBounds._7_1_ = 1;
  }
  bVar3 = DoAggressiveIntTypeSpec(this);
  if (((!bVar3) && (bVar3 = IsLoopPrePass(this), bVar3)) &&
     (bVar3 = ValueType::IsInt((ValueType *)((long)&this_local + 6)), !bVar3)) {
    bVar3 = IR::Opnd::IsRegOpnd(pOStack_48);
    if (!bVar3) {
      return;
    }
    pRVar8 = IR::Opnd::AsRegOpnd(pOStack_48);
    ToVarRegOpnd(this,pRVar8,this->currentBlock);
    return;
  }
  local_58 = (IntBounds *)0x0;
  if (((addSubConstantInfo != (AddSubConstantInfo *)0x0) &&
      (bVar3 = AddSubConstantInfo::SrcValueIsLikelyConstant(addSubConstantInfo), !bVar3)) &&
     (bVar3 = DoTrackRelativeIntBounds(this), bVar3)) {
    if ((*(uint *)&this->field_0xf4 >> 2 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x21b3,"(!ignoredIntOverflowForCurrentInstr)",
                         "!ignoredIntOverflowForCurrentInstr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar3 = ValueType::IsInt((ValueType *)((long)&this_local + 6));
    if ((!bVar3) || ((dstBounds._7_1_ & 1) == 0)) {
      newMin = -0x80000000;
      newMax = 0x7fffffff;
    }
    pVVar5 = AddSubConstantInfo::SrcValue(addSubConstantInfo);
    n = AddSubConstantInfo::Offset(addSubConstantInfo);
    bVar2 = dstBounds._7_1_;
    IntConstantBounds::IntConstantBounds
              ((IntConstantBounds *)&stack0xffffffffffffffa0,newMin,newMax);
    local_58 = IntBounds::Add(pVVar5,n,(bool)(bVar2 & 1),
                              (IntConstantBounds *)&stack0xffffffffffffffa0,this->alloc);
  }
  if (src1Value_local != (Value *)0x0) {
    if (addSubConstantInfo != (AddSubConstantInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x21cc,"(!addSubConstantInfo)","!addSubConstantInfo");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pVVar5 = ValueNumberTransferDst(this,pIStack_20,src1Value_local);
    *pDstVal = pVVar5;
    pGVar6 = CurrentBlockData(this);
    GlobOptBlockData::InsertNewValue(pGVar6,*pDstVal,pOStack_48);
    goto LAB_005a63da;
  }
  bVar3 = ValueType::IsInt((ValueType *)((long)&this_local + 6));
  if ((!bVar3) || ((dstBounds._7_1_ & 1) == 0)) {
    if (local_58 == (IntBounds *)0x0) {
      local_98 = NewGenericValue(this,(ValueType)this_local._6_2_);
    }
    else {
      local_98 = NewIntBoundedValue(this,(ValueType)this_local._6_2_,local_58,false,(Opnd *)0x0);
    }
    *pDstVal = local_98;
    goto LAB_005a63da;
  }
  local_61 = false;
  if ((newMin < 1) && (-1 < newMax)) {
    if (valToTransfer_local._6_2_ == Neg_A) {
LAB_005a62f8:
      e = IR::operator&(bailOutKind,BailOutOnNegativeZero);
      bVar3 = IR::operator!(e);
      local_61 = (bool)((bVar3 ^ 0xffU) & 1);
    }
    else if (valToTransfer_local._6_2_ == Add_A) {
      if (src2Value_local == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x21d9,"(src1Value)","src1Value");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      if (dst == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x21da,"(src2Value)","src2Value");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pVVar7 = ::Value::GetValueInfo(src2Value_local);
      bVar3 = ValueInfo::WasNegativeZeroPreventedByBailout(pVVar7);
      local_85 = false;
      if (bVar3) {
        pVVar7 = ::Value::GetValueInfo((Value *)dst);
        local_85 = ValueInfo::WasNegativeZeroPreventedByBailout(pVVar7);
      }
      local_61 = local_85;
    }
    else {
      if ((valToTransfer_local._6_2_ == Div_A) || ((ushort)(valToTransfer_local._6_2_ - Mul_A) < 2))
      goto LAB_005a62f8;
      if (valToTransfer_local._6_2_ == Sub_A) {
        if (src2Value_local == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x21e2,"(src1Value)","src1Value");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pVVar7 = ::Value::GetValueInfo(src2Value_local);
        local_61 = ValueInfo::WasNegativeZeroPreventedByBailout(pVVar7);
      }
    }
  }
  if (local_58 == (IntBounds *)0x0) {
    local_90 = NewIntRangeValue(this,newMin,newMax,local_61,(Opnd *)0x0);
  }
  else {
    local_90 = NewIntBoundedValue(this,(ValueType)this_local._6_2_,local_58,local_61,(Opnd *)0x0);
  }
  *pDstVal = local_90;
LAB_005a63da:
  if ((addSubConstantInfo != (AddSubConstantInfo *)0x0) ||
     ((*(uint *)&this->field_0xf4 >> 6 & 1) != 0)) {
    TrackIntSpecializedAddSubConstant
              (this,pIStack_20,addSubConstantInfo,*pDstVal,local_58 != (IntBounds *)0x0);
  }
  pGVar6 = CurrentBlockData(this);
  GlobOptBlockData::SetValue(pGVar6,*pDstVal,pOStack_48);
  bVar3 = IR::Opnd::IsRegOpnd(pOStack_48);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2200,"(dst->IsRegOpnd())","What else?");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  instr_00 = pIStack_20;
  pRVar8 = IR::Opnd::AsRegOpnd(pOStack_48);
  ToInt32Dst(this,instr_00,pRVar8,this->currentBlock);
  return;
}

Assistant:

void
GlobOpt::TypeSpecializeIntDst(IR::Instr* instr, Js::OpCode originalOpCode, Value* valToTransfer, Value *const src1Value, Value *const src2Value, const IR::BailOutKind bailOutKind, ValueType valueType, int32 newMin, int32 newMax, Value** pDstVal, const AddSubConstantInfo *const addSubConstantInfo)
{
    Assert(valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0));
    Assert(!valToTransfer || valToTransfer == src1Value);
    Assert(!addSubConstantInfo || addSubConstantInfo->HasInfo());

    IR::Opnd *dst = instr->GetDst();
    Assert(dst);

    bool isValueInfoPrecise;
    if(IsLoopPrePass())
    {
        isValueInfoPrecise = IsPrepassSrcValueInfoPrecise(instr, src1Value, src2Value);
        valueType = GetPrepassValueTypeForDst(valueType, instr, src1Value, src2Value, isValueInfoPrecise);
    }
    else
    {
        isValueInfoPrecise = true;
    }

    // If dst has a circular reference in a loop, it probably won't get specialized. Don't mark the dst as type-specialized on
    // the pre-pass. With aggressive int spec though, it will take care of bailing out if necessary so there's no need to assume
    // that the dst will be a var even if it's live on the back-edge. Also if the op always produces an int32, then there's no
    // ambiguity in the dst's value type even in the prepass.
    if (!DoAggressiveIntTypeSpec() && this->IsLoopPrePass() && !valueType.IsInt())
    {
        if (dst->IsRegOpnd())
        {
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        return;
    }

    const IntBounds *dstBounds = nullptr;
    if(addSubConstantInfo && !addSubConstantInfo->SrcValueIsLikelyConstant() && DoTrackRelativeIntBounds())
    {
        Assert(!ignoredIntOverflowForCurrentInstr);

        // Track bounds for add or sub with a constant. For instance, consider (b = a + 2). The value of 'b' should track that
        // it is equal to (the value of 'a') + 2. Additionally, the value of 'b' should inherit the bounds of 'a', offset by
        // the constant value.
        if(!valueType.IsInt() || !isValueInfoPrecise)
        {
            newMin = INT32_MIN;
            newMax = INT32_MAX;
        }
        dstBounds =
            IntBounds::Add(
                addSubConstantInfo->SrcValue(),
                addSubConstantInfo->Offset(),
                isValueInfoPrecise,
                IntConstantBounds(newMin, newMax),
                alloc);
    }

    // Src1's value could change later in the loop, so the value wouldn't be the same for each
    // iteration.  Since we don't iterate over loops "while (!changed)", go conservative on the
    // pre-pass.
    if (valToTransfer)
    {
        // If this is just a copy, no need for creating a new value.
        Assert(!addSubConstantInfo);
        *pDstVal = this->ValueNumberTransferDst(instr, valToTransfer);
        CurrentBlockData()->InsertNewValue(*pDstVal, dst);
    }
    else if (valueType.IsInt() && isValueInfoPrecise)
    {
        bool wasNegativeZeroPreventedByBailout = false;
        if(newMin <= 0 && newMax >= 0)
        {
            switch(originalOpCode)
            {
                case Js::OpCode::Add_A:
                    // -0 + -0 == -0
                    Assert(src1Value);
                    Assert(src2Value);
                    wasNegativeZeroPreventedByBailout =
                        src1Value->GetValueInfo()->WasNegativeZeroPreventedByBailout() &&
                        src2Value->GetValueInfo()->WasNegativeZeroPreventedByBailout();
                    break;

                case Js::OpCode::Sub_A:
                    // -0 - 0 == -0
                    Assert(src1Value);
                    wasNegativeZeroPreventedByBailout = src1Value->GetValueInfo()->WasNegativeZeroPreventedByBailout();
                    break;

                case Js::OpCode::Neg_A:
                case Js::OpCode::Mul_A:
                case Js::OpCode::Div_A:
                case Js::OpCode::Rem_A:
                    wasNegativeZeroPreventedByBailout = !!(bailOutKind & IR::BailOutOnNegativeZero);
                    break;
            }
        }

        *pDstVal =
            dstBounds
                ? NewIntBoundedValue(valueType, dstBounds, wasNegativeZeroPreventedByBailout, nullptr)
                : NewIntRangeValue(newMin, newMax, wasNegativeZeroPreventedByBailout, nullptr);
    }
    else
    {
        *pDstVal = dstBounds ? NewIntBoundedValue(valueType, dstBounds, false, nullptr) : NewGenericValue(valueType);
    }

    if(addSubConstantInfo || updateInductionVariableValueNumber)
    {
        TrackIntSpecializedAddSubConstant(instr, addSubConstantInfo, *pDstVal, !!dstBounds);
    }

    CurrentBlockData()->SetValue(*pDstVal, dst);

    AssertMsg(dst->IsRegOpnd(), "What else?");
    this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
}